

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ExceptionOr<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>::
~ExceptionOr(ExceptionOr<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo> *this)

{
  if ((this->value).ptr.isSet == true) {
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&(this->value).ptr.field_1.value);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)this);
  return;
}

Assistant:

ExceptionOr() = default;